

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O2

int cmdline_parser_config_file
              (char *filename,gengetopt_args_info *args_info,cmdline_parser_params *params)

{
  int iVar1;
  int iVar2;
  line_list *plVar3;
  char *pcVar4;
  char **argv;
  line_list **pplVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  line_list *__ptr;
  int my_argc;
  
  my_argc = 1;
  plVar3 = (line_list *)malloc(0x10);
  cmd_line_list_tmp = plVar3;
  plVar3->next = cmd_line_list;
  cmd_line_list = plVar3;
  pcVar4 = gengetopt_strdup("nanorod_pentBuilder");
  cmd_line_list->string_arg = pcVar4;
  iVar1 = _cmdline_parser_configfile(filename,&my_argc);
  iVar2 = my_argc;
  if (iVar1 == 0) {
    uVar7 = (ulong)(uint)my_argc;
    lVar8 = (long)my_argc;
    argv = (char **)malloc(lVar8 * 8 + 8);
    pplVar5 = &cmd_line_list;
    for (; cmd_line_list_tmp = *pplVar5, 0 < (int)uVar7; uVar7 = uVar7 - 1) {
      argv[uVar7 - 1] = cmd_line_list_tmp->string_arg;
      pplVar5 = &cmd_line_list_tmp->next;
    }
    argv[lVar8] = (char *)0x0;
    sVar6 = strlen(filename);
    pcVar4 = (char *)malloc(sVar6 + 0x18);
    builtin_strncpy(pcVar4," in configuration file ",0x18);
    strcat(pcVar4,filename);
    iVar2 = cmdline_parser_internal(iVar2,argv,args_info,params,pcVar4);
    free(pcVar4);
    free(argv);
  }
  else {
    iVar2 = 1;
  }
  plVar3 = cmd_line_list;
  if (cmd_line_list != (line_list *)0x0) {
    do {
      __ptr = plVar3;
      plVar3 = __ptr->next;
      free(__ptr->string_arg);
      free(__ptr);
    } while (plVar3 != (line_list *)0x0);
    cmd_line_list = (line_list *)0x0;
    cmd_line_list_tmp = __ptr;
  }
  return iVar2;
}

Assistant:

int
cmdline_parser_config_file (const char *filename,
                           struct gengetopt_args_info *args_info,
                           struct cmdline_parser_params *params)
{
  int i, result;
  int my_argc = 1;
  char **my_argv_arg;
  char *additional_error;

  /* store the program name */
  cmd_line_list_tmp = (struct line_list *) malloc (sizeof (struct line_list));
  cmd_line_list_tmp->next = cmd_line_list;
  cmd_line_list = cmd_line_list_tmp;
  cmd_line_list->string_arg = gengetopt_strdup (CMDLINE_PARSER_PACKAGE);

  result = _cmdline_parser_configfile(filename, &my_argc);

  if (result != EXIT_FAILURE) {
    my_argv_arg = (char **) malloc((my_argc+1) * sizeof(char *));
    cmd_line_list_tmp = cmd_line_list;

    for (i = my_argc - 1; i >= 0; --i) {
      my_argv_arg[i] = cmd_line_list_tmp->string_arg;
      cmd_line_list_tmp = cmd_line_list_tmp->next;
    }

    my_argv_arg[my_argc] = 0;

    additional_error = (char *)malloc(strlen(filename) + strlen(ADDITIONAL_ERROR) + 1);
    strcpy (additional_error, ADDITIONAL_ERROR);
    strcat (additional_error, filename);
    result =
      cmdline_parser_internal (my_argc, my_argv_arg, args_info,
                              params,
                              additional_error);

    free (additional_error);
    free (my_argv_arg);
  }

  free_cmd_list();
  return result;
}